

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::Maybe<capnp::Orphan<capnp::compiler::Token>_>::Maybe
          (Maybe<capnp::Orphan<capnp::compiler::Token>_> *this,
          Maybe<capnp::Orphan<capnp::compiler::Token>_> *other)

{
  bool bVar1;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1.value.builder.segment = (other->ptr).field_1.value.builder.segment;
    (this->ptr).field_1.value.builder.capTable = (other->ptr).field_1.value.builder.capTable;
    (this->ptr).field_1.value.builder.location = (other->ptr).field_1.value.builder.location;
    (this->ptr).field_1.value.builder.tag.content = (other->ptr).field_1.value.builder.tag.content;
    (other->ptr).field_1.value.builder.segment = (SegmentBuilder *)0x0;
    (other->ptr).field_1.value.builder.location = (word *)0x0;
  }
  if (((other->ptr).isSet == true) &&
     ((other->ptr).isSet = false,
     (other->ptr).field_1.value.builder.segment != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&(other->ptr).field_1.value.builder);
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }